

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator-=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>
          *x)

{
  uint uVar1;
  double *pdVar2;
  bool bVar3;
  uint ssize;
  ulong uVar4;
  int i;
  ulong uVar5;
  value_type vVar6;
  
  ssize = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::size
                    (&x->fadexpr_);
  if (ssize != 0) {
    uVar1 = (this->dx_).num_elts;
    if (uVar1 == 0) {
      Vector<double>::resize(&this->dx_,ssize);
      pdVar2 = (this->dx_).ptr_to_data;
      bVar3 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::
              hasFastAccess(&x->fadexpr_);
      uVar4 = 0;
      if (0 < (int)ssize) {
        uVar4 = (ulong)ssize;
      }
      uVar5 = 0;
      if (bVar3) {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::
                  fastAccessDx(&x->fadexpr_,(int)uVar5);
          pdVar2[uVar5] = -vVar6;
        }
      }
      else {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::
                  dx(&x->fadexpr_,(int)uVar5);
          pdVar2[uVar5] = -vVar6;
        }
      }
    }
    else {
      pdVar2 = (this->dx_).ptr_to_data;
      bVar3 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::
              hasFastAccess(&x->fadexpr_);
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar5 = 0;
      if (bVar3) {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::
                  fastAccessDx(&x->fadexpr_,(int)uVar5);
          pdVar2[uVar5] = pdVar2[uVar5] - vVar6;
        }
      }
      else {
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::
                  dx(&x->fadexpr_,(int)uVar5);
          pdVar2[uVar5] = pdVar2[uVar5] - vVar6;
        }
      }
    }
  }
  vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>::val
                    (&x->fadexpr_);
  this->val_ = this->val_ - vVar6;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator-= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<sz; ++i)
	  dxp[i] -= x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] -= x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for(int i=0; i<xsz; ++i)
	  dxp[i] = -x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = -x.dx(i);
    }
  }

  val_ -= x.val();


  return *this;
}